

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter_p.h
# Opt level: O3

void __thiscall QCompleterPrivate::~QCompleterPrivate(QCompleterPrivate *this)

{
  ~QCompleterPrivate(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

~QCompleterPrivate() { delete popup; }